

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotStems<signed_char>
               (char *label_id,char *xs,char *ys,int count,double y_ref,int offset,int stride)

{
  GetterXsYs<signed_char> get_mark;
  GetterXsYRef<signed_char> get_base;
  GetterXsYs<signed_char> local_40;
  GetterXsYRef<signed_char> local_20;
  
  if (count == 0) {
    local_40.Offset = 0;
  }
  else {
    local_40.Offset = (offset % count + count) % count;
  }
  local_40.Xs = xs;
  local_40.Ys = ys;
  local_40.Count = count;
  local_40.Stride = stride;
  local_20.Xs = xs;
  local_20.YRef = y_ref;
  local_20.Count = count;
  local_20.Offset = local_40.Offset;
  local_20.Stride = stride;
  PlotStemsEx<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYRef<signed_char>>
            (label_id,&local_40,&local_20);
  return;
}

Assistant:

void PlotStems(const char* label_id, const T* xs, const T* ys, int count, double y_ref, int offset, int stride) {
    GetterXsYs<T> get_mark(xs,ys,count,offset,stride);
    GetterXsYRef<T> get_base(xs,y_ref,count,offset,stride);
    PlotStemsEx(label_id, get_mark, get_base);
}